

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

uint Extra_ReadBinary(char *Buffer)

{
  int local_18;
  uint local_14;
  int i;
  uint Result;
  char *Buffer_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    if (Buffer[local_18] == '\0') {
      return local_14;
    }
    if ((Buffer[local_18] != '0') && (Buffer[local_18] != '1')) break;
    local_14 = (local_14 * 2 + (int)Buffer[local_18]) - 0x30;
    local_18 = local_18 + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilFile.c"
                ,0x1e1,"unsigned int Extra_ReadBinary(char *)");
}

Assistant:

unsigned Extra_ReadBinary( char * Buffer )
{
    unsigned Result;
    int i;

    Result = 0;
    for ( i = 0; Buffer[i]; i++ )
        if ( Buffer[i] == '0' || Buffer[i] == '1' )
            Result = Result * 2 + Buffer[i] - '0';
        else
        {
            assert( 0 );
        }
    return Result;
}